

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O1

void __thiscall
LUPMatrix::LUPMatrix
          (LUPMatrix *this,Matrix *l,Matrix *u,Permutation *row_permutation,
          Permutation *column_permutation)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = l->m_;
  (this->l_).n_ = l->n_;
  (this->l_).m_ = iVar1;
  (this->l_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (l->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->l_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (l->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->l_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (l->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (l->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (l->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (l->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = u->m_;
  (this->u_).n_ = u->n_;
  (this->u_).m_ = iVar1;
  (this->u_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (u->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->u_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (u->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->u_).elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (u->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (u->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (u->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (u->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->row_permutation_).permutation_,&row_permutation->permutation_);
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->column_permutation_).permutation_,&column_permutation->permutation_);
  bVar2 = Matrix::IsLowerTriangular(&this->l_);
  if (!bVar2) {
    __assert_fail("l_.IsLowerTriangular()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/lup_matrix.cpp"
                  ,10,
                  "LUPMatrix::LUPMatrix(Matrix, Matrix, const Permutation &, const Permutation &)");
  }
  bVar2 = Matrix::IsUpperTriangular(&this->u_);
  if (bVar2) {
    return;
  }
  __assert_fail("u_.IsUpperTriangular()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/lup_matrix.cpp"
                ,0xb,
                "LUPMatrix::LUPMatrix(Matrix, Matrix, const Permutation &, const Permutation &)");
}

Assistant:

LUPMatrix::LUPMatrix(Matrix l, Matrix u,
                     const Permutation& row_permutation,
                     const Permutation& column_permutation)
    : l_(std::move(l)),
      u_(std::move(u)),
      row_permutation_(row_permutation),
      column_permutation_(column_permutation) {
  assert(l_.IsLowerTriangular());
  assert(u_.IsUpperTriangular());
}